

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

wchar_t * el_wgets(EditLine *el,wchar_t *nread)

{
  wchar_t **ppwVar1;
  wchar_t *pwVar2;
  el_action_t eVar3;
  wchar_t wVar4;
  int iVar5;
  wchar_t wVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  undefined1 uVar9;
  wchar_t ch;
  keymacro_value_t local_40;
  wchar_t nrb;
  
  pwVar7 = &nrb;
  if (nread != (wchar_t *)0x0) {
    pwVar7 = nread;
  }
  *pwVar7 = L'\0';
  el->el_read->read_errno = L'\0';
  wVar4 = el->el_flags;
  if ((wVar4 & 2U) != 0) {
    (el->el_line).lastchar = (el->el_line).buffer;
LAB_0010d6fe:
    pwVar7 = noedit_wgets(el,pwVar7);
    return pwVar7;
  }
  if ((wVar4 & 8U) == 0) {
    read_prepare(el);
    wVar4 = el->el_flags;
  }
  if ((wVar4 & 4U) != 0) {
    if ((wVar4 & 8U) == 0) {
      (el->el_line).lastchar = (el->el_line).buffer;
    }
    terminal__flush(el);
    goto LAB_0010d6fe;
  }
switchD_0010d612_caseD_3:
  wVar4 = el_wgetc(el,&ch);
  if (wVar4 == L'\x01') {
    if ((el->el_state).metanext != L'\0') {
      (el->el_state).metanext = L'\0';
      ch = ch | 0x80;
    }
    uVar9 = 9;
    if ((ch < L'Ā') && (uVar9 = (el->el_map).current[(uint)(ch & 0xff)], uVar9 == 0x19)) {
      wVar4 = keymacro_get(el,&ch,&local_40);
      uVar9 = local_40.cmd;
      if (wVar4 != L'\0') {
        if (wVar4 != L'\x01') {
          if (wVar4 != L'\x02') {
            abort();
          }
          goto LAB_0010d71d;
        }
        el_wpush(el,(wchar_t *)CONCAT71(local_40._1_7_,local_40.cmd));
        uVar9 = 0x19;
      }
      if (uVar9 == 0x19) goto switchD_0010d612_caseD_3;
    }
    if ((ulong)(byte)uVar9 < (el->el_map).nfunc) {
      (el->el_state).thiscmd = uVar9;
      (el->el_state).thisch = ch;
      if ((((el->el_map).type == L'\x01') && ((el->el_map).current == (el->el_map).key)) &&
         (pwVar8 = (el->el_chared).c_redo.pos, pwVar8 < (el->el_chared).c_redo.lim)) {
        if ((uVar9 == 0x3a) && (pwVar8 != (el->el_chared).c_redo.buf)) {
          iVar5 = iswprint(pwVar8[-1]);
          if (iVar5 != 0) {
            ppwVar1 = &(el->el_chared).c_redo.pos;
            *ppwVar1 = *ppwVar1 + -1;
            goto LAB_0010d5e2;
          }
          pwVar8 = (el->el_chared).c_redo.pos;
        }
        (el->el_chared).c_redo.pos = pwVar8 + 1;
        *pwVar8 = ch;
      }
LAB_0010d5e2:
      eVar3 = (*(el->el_map).func[(byte)uVar9])(el,ch);
      (el->el_state).lastcmd = uVar9;
      wVar4 = L'\xffffffff';
      switch(eVar3) {
      case '\0':
        goto switchD_0010d612_caseD_0;
      case '\x01':
        wVar4 = (wchar_t)((ulong)((long)(el->el_line).lastchar - (long)(el->el_line).buffer) >> 2);
        goto switchD_0010d612_caseD_0;
      case '\x02':
        wVar4 = L'\0';
        if ((el->el_flags & L'\b') != L'\0') {
          pwVar2 = (el->el_line).lastchar;
          pwVar8 = pwVar2 + 1;
          (el->el_line).lastchar = pwVar8;
          *pwVar2 = L'\x04';
          (el->el_line).cursor = pwVar8;
          wVar4 = L'\x01';
        }
        goto switchD_0010d612_caseD_0;
      case '\x03':
        goto switchD_0010d612_caseD_3;
      case '\x04':
        goto switchD_0010d612_caseD_4;
      case '\x05':
        re_refresh_cursor(el);
        break;
      default:
        terminal_beep(el);
        terminal__flush(el);
        break;
      case '\a':
        re_clear_display(el);
        ch_reset(el);
        read_clearmacros(&el->el_read->macros);
        goto switchD_0010d612_caseD_4;
      case '\b':
        re_clear_lines(el);
        re_clear_display(el);
switchD_0010d612_caseD_4:
        re_refresh(el);
        break;
      case '\t':
        re_refresh(el);
        terminal_beep(el);
      }
      wVar4 = L'\xffffffff';
switchD_0010d612_caseD_0:
      (el->el_state).doingarg = L'\0';
      (el->el_state).argument = L'\x01';
      (el->el_chared).c_vcmd.action = L'\0';
      if (((el->el_flags & L'\b') != L'\0') || (wVar4 != L'\xffffffff')) goto LAB_0010d723;
    }
    goto switchD_0010d612_caseD_3;
  }
LAB_0010d71d:
  wVar4 = L'\xffffffff';
LAB_0010d723:
  terminal__flush(el);
  if ((el->el_flags & L'\b') == L'\0') {
    read_finish(el);
    wVar6 = wVar4;
    if (wVar4 == L'\xffffffff') goto LAB_0010d763;
  }
  else {
    wVar6 = (wchar_t)((ulong)((long)(el->el_line).lastchar - (long)(el->el_line).buffer) >> 2);
  }
  *pwVar7 = wVar6;
  if (wVar6 != L'\0') {
    return (el->el_line).buffer;
  }
  if (wVar4 != L'\xffffffff') {
    return (wchar_t *)0x0;
  }
LAB_0010d763:
  *pwVar7 = L'\xffffffff';
  wVar4 = el->el_read->read_errno;
  if (wVar4 != L'\0') {
    pwVar7 = __errno_location();
    *pwVar7 = wVar4;
  }
  return (wchar_t *)0x0;
}

Assistant:

const wchar_t *
el_wgets(EditLine *el, int *nread)
{
	int retval;
	el_action_t cmdnum = 0;
	int num;		/* how many chars we have read at NL */
	wchar_t ch;
	int nrb;

	if (nread == NULL)
		nread = &nrb;
	*nread = 0;
	el->el_read->read_errno = 0;

	if (el->el_flags & NO_TTY) {
		el->el_line.lastchar = el->el_line.buffer;
		return noedit_wgets(el, nread);
	}

#ifdef FIONREAD
	if (el->el_tty.t_mode == EX_IO && el->el_read->macros.level < 0) {
		int chrs = 0;

		(void) ioctl(el->el_infd, FIONREAD, &chrs);
		if (chrs == 0) {
			if (tty_rawmode(el) < 0) {
				errno = 0;
				*nread = 0;
				return NULL;
			}
		}
	}
#endif /* FIONREAD */

	if ((el->el_flags & UNBUFFERED) == 0)
		read_prepare(el);

	if (el->el_flags & EDIT_DISABLED) {
		if ((el->el_flags & UNBUFFERED) == 0)
			el->el_line.lastchar = el->el_line.buffer;
		terminal__flush(el);
		return noedit_wgets(el, nread);
	}

	for (num = -1; num == -1;) {  /* while still editing this line */
		/* if EOF or error */
		if (read_getcmd(el, &cmdnum, &ch) == -1)
			break;
		if ((size_t)cmdnum >= el->el_map.nfunc) /* BUG CHECK command */
			continue;	/* try again */
		/* now do the real command */
		/* vi redo needs these way down the levels... */
		el->el_state.thiscmd = cmdnum;
		el->el_state.thisch = ch;
		if (el->el_map.type == MAP_VI &&
		    el->el_map.current == el->el_map.key &&
		    el->el_chared.c_redo.pos < el->el_chared.c_redo.lim) {
			if (cmdnum == VI_DELETE_PREV_CHAR &&
			    el->el_chared.c_redo.pos != el->el_chared.c_redo.buf
			    && iswprint(el->el_chared.c_redo.pos[-1]))
				el->el_chared.c_redo.pos--;
			else
				*el->el_chared.c_redo.pos++ = ch;
		}
		retval = (*el->el_map.func[cmdnum]) (el, ch);

		/* save the last command here */
		el->el_state.lastcmd = cmdnum;

		/* use any return value */
		switch (retval) {
		case CC_CURSOR:
			re_refresh_cursor(el);
			break;

		case CC_REDISPLAY:
			re_clear_lines(el);
			re_clear_display(el);
			/* FALLTHROUGH */

		case CC_REFRESH:
			re_refresh(el);
			break;

		case CC_REFRESH_BEEP:
			re_refresh(el);
			terminal_beep(el);
			break;

		case CC_NORM:	/* normal char */
			break;

		case CC_ARGHACK:	/* Suggested by Rich Salz */
			/* <rsalz@pineapple.bbn.com> */
			continue;	/* keep going... */

		case CC_EOF:	/* end of file typed */
			if ((el->el_flags & UNBUFFERED) == 0)
				num = 0;
			else if (num == -1) {
				*el->el_line.lastchar++ = CONTROL('d');
				el->el_line.cursor = el->el_line.lastchar;
				num = 1;
			}
			break;

		case CC_NEWLINE:	/* normal end of line */
			num = (int)(el->el_line.lastchar - el->el_line.buffer);
			break;

		case CC_FATAL:	/* fatal error, reset to known state */
			/* put (real) cursor in a known place */
			re_clear_display(el);	/* reset the display stuff */
			ch_reset(el);	/* reset the input pointers */
			read_clearmacros(&el->el_read->macros);
			re_refresh(el); /* print the prompt again */
			break;

		case CC_ERROR:
		default:	/* functions we don't know about */
			terminal_beep(el);
			terminal__flush(el);
			break;
		}
		el->el_state.argument = 1;
		el->el_state.doingarg = 0;
		el->el_chared.c_vcmd.action = NOP;
		if (el->el_flags & UNBUFFERED)
			break;
	}

	terminal__flush(el);		/* flush any buffered output */
	/* make sure the tty is set up correctly */
	if ((el->el_flags & UNBUFFERED) == 0) {
		read_finish(el);
		*nread = num != -1 ? num : 0;
	} else
		*nread = (int)(el->el_line.lastchar - el->el_line.buffer);

	if (*nread == 0) {
		if (num == -1) {
			*nread = -1;
			if (el->el_read->read_errno)
				errno = el->el_read->read_errno;
		}
		return NULL;
	} else
		return el->el_line.buffer;
}